

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPolComponent_VectorImplementation.h
# Opt level: O1

void __thiscall
PartialJointPolicyPureVector::SetAction
          (PartialJointPolicyPureVector *this,Index agentI,Index domainI,Index aI)

{
  PolicyPureVector *pPVar1;
  long lVar2;
  
  pPVar1 = (this->super_JPolComponent_VectorImplementation)._m_indivPols_PolicyPureVector.
           super__Vector_base<PolicyPureVector_*,_std::allocator<PolicyPureVector_*>_>._M_impl.
           super__Vector_impl_data._M_start[agentI];
  lVar2 = *(long *)&(pPVar1->_m_domainToActionIndices).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data;
  if ((ulong)domainI <
      (ulong)((long)*(pointer *)
                     ((long)&(pPVar1->_m_domainToActionIndices).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                     + 8) - lVar2 >> 2)) {
    *(Index *)(lVar2 + (ulong)domainI * 4) = aI;
    return;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void SetAction(Index agentI, Index domainI, Index aI)
            {_m_indivPols_PolicyPureVector[agentI]->SetAction(domainI, aI);}